

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitCastExpression(SyntaxDumper *this,CastExpressionSyntax *node)

{
  TypeNameSyntax *pTVar1;
  ExpressionSyntax *pEVar2;
  CastExpressionSyntax local_98 [72];
  CastExpressionSyntax local_50 [56];
  CastExpressionSyntax *local_18;
  CastExpressionSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (CastExpressionSyntax *)this;
  traverseExpression(this,(ExpressionSyntax *)node);
  CastExpressionSyntax::openParenthesisToken(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  pTVar1 = CastExpressionSyntax::typeName(local_18);
  (**(code **)(*(long *)this + 0x2f0))(this,pTVar1);
  CastExpressionSyntax::closeParenthesisToken(local_98);
  (**(code **)(*(long *)this + 0x2e8))(this,local_98,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_98);
  pEVar2 = CastExpressionSyntax::expression(local_18);
  (**(code **)(*(long *)this + 0x2f0))(this,pEVar2);
  return Skip;
}

Assistant:

virtual Action visitCastExpression(const CastExpressionSyntax* node) override
    {
        traverseExpression(node);
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->typeName());
        terminal(node->closeParenthesisToken(), node);
        nonterminal(node->expression());
        return Action::Skip;
    }